

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O3

void write_os2_header(j_decompress_ptr cinfo,bmp_dest_ptr dest)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  int map_colors;
  bool bVar7;
  undefined4 local_3a;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined2 local_32;
  byte local_30;
  undefined1 local_2f;
  undefined2 local_2e;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined4 local_28;
  undefined1 local_24;
  undefined1 local_23;
  undefined2 local_22;
  
  JVar1 = cinfo->out_color_space;
  bVar4 = false;
  if (JVar1 == JCS_RGB || JVar1 - JCS_EXT_RGB < 10) {
    bVar7 = cinfo->quantize_colors == 0;
    bVar4 = !bVar7;
    local_30 = bVar7 << 4 | 8;
    map_colors = (uint)bVar4 << 8;
  }
  else {
    local_30 = 0x18;
    if (JVar1 == JCS_CMYK) {
      map_colors = 0;
    }
    else {
      map_colors = 0;
      if (JVar1 != JCS_RGB565) {
        map_colors = 0x100;
        bVar4 = true;
        local_30 = 8;
      }
    }
  }
  uVar2 = cinfo->output_height;
  lVar5 = (ulong)dest->row_width * (ulong)uVar2 + (ulong)(uint)(map_colors * 3) + 0x1a;
  local_28 = 0;
  local_2e = 0x4d42;
  local_2c = (undefined1)lVar5;
  local_2b = (undefined1)((ulong)lVar5 >> 8);
  local_2a = (undefined1)((ulong)lVar5 >> 0x10);
  local_29 = (undefined1)((ulong)lVar5 >> 0x18);
  local_24 = 0x1a;
  local_23 = (undefined1)((uint)(map_colors * 3) >> 8);
  local_22 = 0;
  local_3a = 0xc;
  local_36 = (undefined1)cinfo->output_width;
  local_35 = (undefined1)(cinfo->output_width >> 8);
  local_34 = (undefined1)uVar2;
  local_33 = (undefined1)(uVar2 >> 8);
  local_32 = 1;
  local_2f = 0;
  sVar6 = fwrite(&local_2e,1,0xe,(FILE *)(dest->pub).output_file);
  if (sVar6 != 0xe) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar6 = fwrite(&local_3a,1,0xc,(FILE *)(dest->pub).output_file);
  if (sVar6 != 0xc) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (bVar4) {
    write_colormap(cinfo,(bmp_dest_ptr)(dest->pub).output_file,map_colors,3);
    return;
  }
  return;
}

Assistant:

LOCAL(void)
write_os2_header(j_decompress_ptr cinfo, bmp_dest_ptr dest)
/* Write an OS2-style BMP file header, including colormap if needed */
{
  char bmpfileheader[14];
  char bmpcoreheader[12];
  long headersize, bfSize;
  int bits_per_pixel, cmap_entries;

  /* Compute colormap size and total file size */
  if (IsExtRGB(cinfo->out_color_space)) {
    if (cinfo->quantize_colors) {
      /* Colormapped RGB */
      bits_per_pixel = 8;
      cmap_entries = 256;
    } else {
      /* Unquantized, full color RGB */
      bits_per_pixel = 24;
      cmap_entries = 0;
    }
  } else if (cinfo->out_color_space == JCS_RGB565 ||
             cinfo->out_color_space == JCS_CMYK) {
    bits_per_pixel = 24;
    cmap_entries   = 0;
  } else {
    /* Grayscale output.  We need to fake a 256-entry colormap. */
    bits_per_pixel = 8;
    cmap_entries = 256;
  }
  /* File size */
  headersize = 14 + 12 + cmap_entries * 3; /* Header and colormap */
  bfSize = headersize + (long)dest->row_width * (long)cinfo->output_height;

  /* Set unused fields of header to 0 */
  MEMZERO(bmpfileheader, sizeof(bmpfileheader));
  MEMZERO(bmpcoreheader, sizeof(bmpcoreheader));

  /* Fill the file header */
  bmpfileheader[0] = 0x42;      /* first 2 bytes are ASCII 'B', 'M' */
  bmpfileheader[1] = 0x4D;
  PUT_4B(bmpfileheader, 2, bfSize); /* bfSize */
  /* we leave bfReserved1 & bfReserved2 = 0 */
  PUT_4B(bmpfileheader, 10, headersize); /* bfOffBits */

  /* Fill the info header (Microsoft calls this a BITMAPCOREHEADER) */
  PUT_2B(bmpcoreheader, 0, 12); /* bcSize */
  PUT_2B(bmpcoreheader, 4, cinfo->output_width); /* bcWidth */
  PUT_2B(bmpcoreheader, 6, cinfo->output_height); /* bcHeight */
  PUT_2B(bmpcoreheader, 8, 1);  /* bcPlanes - must be 1 */
  PUT_2B(bmpcoreheader, 10, bits_per_pixel); /* bcBitCount */

  if (JFWRITE(dest->pub.output_file, bmpfileheader, 14) != (size_t)14)
    ERREXIT(cinfo, JERR_FILE_WRITE);
  if (JFWRITE(dest->pub.output_file, bmpcoreheader, 12) != (size_t)12)
    ERREXIT(cinfo, JERR_FILE_WRITE);

  if (cmap_entries > 0)
    write_colormap(cinfo, dest, cmap_entries, 3);
}